

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
detail::reader::operator()
          (reader *this,
          flat_map<boost::basic_string_ref<char,_std::char_traits<char>_>,_boost::basic_string_ref<char,_std::char_traits<char>_>,_std::less<boost::basic_string_ref<char,_std::char_traits<char>_>_>,_void>
          *val)

{
  ushort *puVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  bool bVar5;
  basic_string_ref<char,_std::char_traits<char>_> value;
  basic_string_ref<char,_std::char_traits<char>_> key;
  flat_map<boost::basic_string_ref<char,std::char_traits<char>>,boost::basic_string_ref<char,std::char_traits<char>>,std::less<boost::basic_string_ref<char,std::char_traits<char>>>,void>
  local_40 [16];
  
  puVar1 = (ushort *)(this->buf_).data_;
  uVar2 = (this->buf_).size_;
  uVar4 = *puVar1;
  uVar4 = uVar4 << 8 | uVar4 >> 8;
  uVar3 = 2;
  if (uVar2 < 2) {
    uVar3 = uVar2;
  }
  (this->buf_).data_ = (void *)((long)puVar1 + uVar3);
  (this->buf_).size_ = uVar2 - uVar3;
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    key.ptr_ = (char *)0x0;
    key.len_ = 0;
    operator()(this,&key);
    value.ptr_ = (char *)0x0;
    value.len_ = 0;
    operator()(this,&value);
    boost::container::
    flat_map<boost::basic_string_ref<char,std::char_traits<char>>,boost::basic_string_ref<char,std::char_traits<char>>,std::less<boost::basic_string_ref<char,std::char_traits<char>>>,void>
    ::
    emplace<boost::basic_string_ref<char,std::char_traits<char>>&,boost::basic_string_ref<char,std::char_traits<char>>&>
              (local_40,(basic_string_ref<char,_std::char_traits<char>_> *)val,&key);
  }
  return;
}

Assistant:

void operator()(boost::container::flat_map<K,V>& val) const {
        uint16_t length = 0;
        (*this)(length);
        for (; length; --length) {
            K key;
            (*this)(key);
            V value;
            (*this)(value);
            val.emplace(key,value);
        }
    }